

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

void __thiscall pbrt::LightHandle::Preprocess(LightHandle *this,Bounds3f *sceneBounds)

{
  ulong uVar1;
  ushort uVar2;
  uint uVar3;
  anon_class_8_1_e43d4cc1 preprocess;
  PortalImageInfiniteLight *this_00;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (uVar2 == 2) {
      DistantLight::Preprocess((DistantLight *)(uVar1 & 0xffffffffffff),sceneBounds);
      return;
    }
  }
  else if (2 < uVar2 - 4) {
    uVar3 = uVar2 - 6;
    this_00 = (PortalImageInfiniteLight *)(uVar1 & 0xffffffffffff);
    if (uVar3 < 2) {
      Bounds3<float>::BoundingSphere
                (sceneBounds,
                 (Point3<float> *)&(this_00->portal).values[3].super_Tuple3<pbrt::Point3,_float>.z,
                 &(this_00->portalFrame).x.super_Tuple3<pbrt::Vector3,_float>.z);
      return;
    }
    if (uVar3 != 2) {
      PortalImageInfiniteLight::Preprocess(this_00,sceneBounds);
      return;
    }
    Bounds3<float>::BoundingSphere
              (sceneBounds,(Point3<float> *)((long)&(this_00->image).p8.nAlloc + 4),
               (Float *)&(this_00->image).p16);
    return;
  }
  return;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }